

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall ON_CheckSum::Write(ON_CheckSum *this,ON_BinaryArchive *archive)

{
  int iVar1;
  undefined1 local_58 [8];
  uchar b [48];
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_CheckSum *this_local;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar1 < 4) {
    memset(local_58,0,0x30);
    local_19 = ON_BinaryArchive::WriteByte(archive,0x30,local_58);
  }
  else {
    local_19 = ON_BinaryArchive::WriteBigSize(archive,this->m_size);
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteBigTime(archive,this->m_time);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(archive,8,this->m_crc);
    }
  }
  return local_19;
}

Assistant:

bool ON_CheckSum::Write(ON_BinaryArchive& archive) const
{
  bool rc = false;
  if ( archive.Archive3dmVersion() < 4 )
  {
    // V3 files had other information
    // 48 bytes of zeros will work ok
    unsigned char b[48];
    memset(b,0,sizeof(b));
    rc = archive.WriteByte(48,b);
  }
  else
  {
    rc = archive.WriteBigSize(m_size);
    if (rc)
      rc = archive.WriteBigTime(m_time);
    if (rc)
      rc = archive.WriteInt(8,&m_crc[0]);
  }
  return rc;
}